

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigOper.c
# Opt level: O1

Aig_Obj_t * Aig_IthVar(Aig_Man_t *p,int i)

{
  int iVar1;
  
  if (p->nObjs[2] <= i) {
    iVar1 = (i - p->nObjs[2]) + 1;
    do {
      Aig_ObjCreateCi(p);
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  if (i < p->vCis->nSize) {
    if (-1 < i) {
      return (Aig_Obj_t *)p->vCis->pArray[(uint)i];
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  __assert_fail("i < Vec_PtrSize(p->vCis)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigOper.c"
                ,0x44,"Aig_Obj_t *Aig_IthVar(Aig_Man_t *, int)");
}

Assistant:

Aig_Obj_t * Aig_IthVar( Aig_Man_t * p, int i )
{
    int v;
    for ( v = Aig_ManCiNum(p); v <= i; v++ )
        Aig_ObjCreateCi( p );
    assert( i < Vec_PtrSize(p->vCis) );
    return Aig_ManCi( p, i );
}